

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall CLI::App::get_subcommand(App *this,string *subcom)

{
  OptionNotFound *this_00;
  string local_40;
  App *local_20;
  App *subc;
  string *subcom_local;
  App *this_local;
  
  subc = (App *)subcom;
  subcom_local = (string *)this;
  local_20 = _find_subcommand(this,subcom,false,false);
  if (local_20 == (App *)0x0) {
    this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string((string *)&local_40,(string *)subcom);
    OptionNotFound::OptionNotFound(this_00,&local_40);
    __cxa_throw(this_00,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  return local_20;
}

Assistant:

App *get_subcommand(std::string subcom) const {
        auto subc = _find_subcommand(subcom, false, false);
        if(subc == nullptr)
            throw OptionNotFound(subcom);
        return subc;
    }